

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libSupport.c
# Opt level: O2

void call_inits(Abc_Frame_t *pAbc)

{
  code *pcVar1;
  uint lib_num;
  void **ppvVar2;
  
  lib_num = 0;
  for (ppvVar2 = libHandles; *ppvVar2 != (void *)0x0; ppvVar2 = ppvVar2 + 1) {
    pcVar1 = (code *)get_fnct_ptr(lib_num,"abc_init");
    if (pcVar1 == (code *)0x0) {
      printf("Warning: Failed to initialize library %d.\n",(ulong)lib_num);
    }
    else {
      (*pcVar1)(pAbc);
    }
    lib_num = lib_num + 1;
  }
  return;
}

Assistant:

void call_inits(Abc_Frame_t* pAbc) {
    int i;
    lib_init_end_func init_func;
    for (i = 0; libHandles[i] != 0; i++) {
        init_func = (lib_init_end_func) get_fnct_ptr(i, "abc_init");
        if (init_func == 0) {
            printf("Warning: Failed to initialize library %d.\n", i);
        } else {
            (*init_func)(pAbc);
        }
    }
}